

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O1

posix_time __thiscall booster::locale::impl_icu::calendar_impl::get_time(calendar_impl *this)

{
  ulong uVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  posix_time pVar5;
  UErrorCode code;
  guard l;
  UErrorCode local_2c;
  unique_lock<std::mutex> local_28;
  
  local_2c = U_ZERO_ERROR;
  local_28._M_device = &this->lock_;
  local_28._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  dVar3 = (double)icu_70::Calendar::getTimeInMillis((UErrorCode *)(this->calendar_).ptr_);
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  check_and_throw_dt(&local_2c);
  dVar4 = floor(dVar3 / 1000.0);
  uVar1 = (ulong)((dVar3 / 1000.0 - dVar4) / 1000000000.0);
  uVar2 = 999999999;
  if ((uint)uVar1 < 999999999) {
    uVar2 = uVar1 & 0xffffffff;
  }
  pVar5.seconds = (long)dVar4;
  pVar5._8_8_ = uVar2;
  return pVar5;
}

Assistant:

virtual posix_time get_time() const
        {
            
            UErrorCode code=U_ZERO_ERROR;
            double rtime = 0;
            {
                guard l(lock_);
                rtime = calendar_->getTime(code);
            }
            check_and_throw_dt(code);
            rtime/=1000.0;
            double secs = floor(rtime);
            posix_time res;
            res.seconds = static_cast<int64_t>(secs);
            res.nanoseconds = static_cast<uint32_t>((rtime - secs) / 1e9);
            if(res.nanoseconds > 999999999)
                res.nanoseconds = 999999999;
            return res;
        }